

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O0

int glad_gl_find_core_gl(void)

{
  int iVar1;
  size_t __n;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  bool local_58;
  bool local_57;
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  size_t length;
  char *prefixes [4];
  GLubyte *local_20;
  char *version;
  int minor;
  int major;
  int i;
  
  prefixes[0] = "OpenGL ES-CL ";
  prefixes[1] = "OpenGL ES ";
  prefixes[2] = (char *)0x0;
  local_20 = (*glad_glGetString)(0x1f02);
  if (local_20 == (GLubyte *)0x0) {
    major = 0;
  }
  else {
    minor = 0;
    while (prefixes[(long)minor + -1] != (char *)0x0) {
      __n = strlen(prefixes[(long)minor + -1]);
      iVar1 = strncmp((char *)local_20,prefixes[(long)minor + -1],__n);
      if (iVar1 == 0) {
        local_20 = local_20 + __n;
        break;
      }
      minor = minor + 1;
    }
    __isoc99_sscanf(local_20,"%d.%d",(long)&version + 4,&version);
    if ((version._4_4_ != 1) || (local_51 = true, (int)version < 0)) {
      local_51 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_0 = (int)local_51;
    if ((version._4_4_ != 1) || (local_52 = true, (int)version < 1)) {
      local_52 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_1 = (int)local_52;
    if ((version._4_4_ != 1) || (local_53 = true, (int)version < 2)) {
      local_53 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_2 = (int)local_53;
    if ((version._4_4_ != 1) || (local_54 = true, (int)version < 3)) {
      local_54 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_3 = (int)local_54;
    if ((version._4_4_ != 1) || (local_55 = true, (int)version < 4)) {
      local_55 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_4 = (int)local_55;
    if ((version._4_4_ != 1) || (local_56 = true, (int)version < 5)) {
      local_56 = 1 < version._4_4_;
    }
    GLAD_GL_VERSION_1_5 = (int)local_56;
    if ((version._4_4_ != 2) || (local_57 = true, (int)version < 0)) {
      local_57 = 2 < version._4_4_;
    }
    GLAD_GL_VERSION_2_0 = (int)local_57;
    if ((version._4_4_ != 2) || (local_58 = true, (int)version < 1)) {
      local_58 = 2 < version._4_4_;
    }
    GLAD_GL_VERSION_2_1 = (int)local_58;
    if ((version._4_4_ != 3) || (local_59 = true, (int)version < 0)) {
      local_59 = 3 < version._4_4_;
    }
    GLAD_GL_VERSION_3_0 = (int)local_59;
    if ((version._4_4_ != 3) || (local_5a = true, (int)version < 1)) {
      local_5a = 3 < version._4_4_;
    }
    GLAD_GL_VERSION_3_1 = (int)local_5a;
    if ((version._4_4_ != 3) || (local_5b = true, (int)version < 2)) {
      local_5b = 3 < version._4_4_;
    }
    GLAD_GL_VERSION_3_2 = (int)local_5b;
    if ((version._4_4_ != 3) || (local_5c = true, (int)version < 3)) {
      local_5c = 3 < version._4_4_;
    }
    GLAD_GL_VERSION_3_3 = (int)local_5c;
    major = version._4_4_ * 10000 + (int)version;
  }
  return major;
}

Assistant:

static int glad_gl_find_core_gl(void) {
    int i, major, minor;
    const char* version;
    const char* prefixes[] = {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };
    version = (const char*) glGetString(GL_VERSION);
    if (!version) return 0;
    for (i = 0;  prefixes[i];  i++) {
        const size_t length = strlen(prefixes[i]);
        if (strncmp(version, prefixes[i], length) == 0) {
            version += length;
            break;
        }
    }

    GLAD_IMPL_UTIL_SSCANF(version, "%d.%d", &major, &minor);

    GLAD_GL_VERSION_1_0 = (major == 1 && minor >= 0) || major > 1;
    GLAD_GL_VERSION_1_1 = (major == 1 && minor >= 1) || major > 1;
    GLAD_GL_VERSION_1_2 = (major == 1 && minor >= 2) || major > 1;
    GLAD_GL_VERSION_1_3 = (major == 1 && minor >= 3) || major > 1;
    GLAD_GL_VERSION_1_4 = (major == 1 && minor >= 4) || major > 1;
    GLAD_GL_VERSION_1_5 = (major == 1 && minor >= 5) || major > 1;
    GLAD_GL_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
    GLAD_GL_VERSION_2_1 = (major == 2 && minor >= 1) || major > 2;
    GLAD_GL_VERSION_3_0 = (major == 3 && minor >= 0) || major > 3;
    GLAD_GL_VERSION_3_1 = (major == 3 && minor >= 1) || major > 3;
    GLAD_GL_VERSION_3_2 = (major == 3 && minor >= 2) || major > 3;
    GLAD_GL_VERSION_3_3 = (major == 3 && minor >= 3) || major > 3;

    return GLAD_MAKE_VERSION(major, minor);
}